

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O3

int32_t uloc_addLikelySubtags_63
                  (char *localeID,char *maximizedLocaleID,int32_t maximizedLocaleIDCapacity,
                  UErrorCode *err)

{
  char cVar1;
  UErrorCode UVar2;
  int iVar3;
  int32_t iVar4;
  uint variantsLength;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  char *__s;
  int32_t length;
  int32_t local_ec;
  int32_t scriptLength;
  int32_t langLength;
  char region [4];
  char script [6];
  char lang [12];
  char localeBuffer [157];
  
  uloc_canonicalize_63(localeID,localeBuffer,0x9d,err);
  UVar2 = *err;
  if ((UVar2 != U_BUFFER_OVERFLOW_ERROR) && (UVar2 != U_STRING_NOT_TERMINATED_WARNING)) {
    if (U_ZERO_ERROR < UVar2) {
      return -1;
    }
    langLength = 0xc;
    scriptLength = 6;
    local_ec = 4;
    if (0 < maximizedLocaleIDCapacity && maximizedLocaleID != (char *)0x0) {
      iVar4 = parseTagString(localeBuffer,lang,&langLength,script,&scriptLength,region,&local_ec,err
                            );
      if (U_ZERO_ERROR < *err) {
        if (*err != U_BUFFER_OVERFLOW_ERROR) {
          return -1;
        }
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
      }
      for (__s = localeBuffer + iVar4; (*__s == '_' || (*__s == '-')); __s = __s + 1) {
      }
      sVar5 = strlen(__s);
      variantsLength = (uint)sVar5;
      if (0 < (int)variantsLength) {
        uVar6 = (ulong)(variantsLength & 0x7fffffff);
        iVar8 = 0;
        pcVar7 = __s;
        do {
          cVar1 = *pcVar7;
          iVar3 = 0;
          if ((cVar1 != '-') && (cVar1 != '_')) {
            if (cVar1 == '@') break;
            if (8 < iVar8) goto LAB_0028e730;
            iVar3 = iVar8 + 1;
          }
          iVar8 = iVar3;
          pcVar7 = pcVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      iVar4 = createLikelySubtagsString
                        (lang,langLength,script,scriptLength,region,local_ec,__s,variantsLength,
                         maximizedLocaleID,maximizedLocaleIDCapacity,err);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = strlen(localeBuffer);
      length = (int32_t)sVar5;
      iVar4 = maximizedLocaleIDCapacity;
      if (length < maximizedLocaleIDCapacity) {
        iVar4 = length;
      }
      memcpy(maximizedLocaleID,localeBuffer,(long)iVar4);
      iVar4 = u_terminateChars_63(maximizedLocaleID,maximizedLocaleIDCapacity,length,err);
      return iVar4;
    }
  }
LAB_0028e730:
  *err = U_ILLEGAL_ARGUMENT_ERROR;
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_addLikelySubtags(const char*    localeID,
         char* maximizedLocaleID,
         int32_t maximizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_addLikelySubtags(
                    localeBuffer,
                    maximizedLocaleID,
                    maximizedLocaleIDCapacity,
                    err);
    }    
}